

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

bool __thiscall
crnlib::vector<crnlib::color_quad<unsigned_char,_int>_>::grant_ownership
          (vector<crnlib::color_quad<unsigned_char,_int>_> *this,color_quad<unsigned_char,_int> *p,
          uint size,uint capacity)

{
  uint in_ECX;
  uint in_EDX;
  ulong in_RSI;
  ulong *in_RDI;
  bool local_1;
  
  if ((*in_RDI < in_RSI + (ulong)in_ECX * 4) &&
     (in_RSI < *in_RDI + (ulong)*(uint *)((long)in_RDI + 0xc) * 4)) {
    local_1 = false;
  }
  else if (in_ECX < in_EDX) {
    local_1 = false;
  }
  else {
    if (in_RSI == 0) {
      if (in_ECX != 0) {
        return false;
      }
    }
    else if (in_ECX == 0) {
      return false;
    }
    clear((vector<crnlib::color_quad<unsigned_char,_int>_> *)CONCAT44(in_EDX,in_ECX));
    *in_RDI = in_RSI;
    *(uint *)(in_RDI + 1) = in_EDX;
    *(uint *)((long)in_RDI + 0xc) = in_ECX;
    local_1 = true;
  }
  return local_1;
}

Assistant:

inline bool grant_ownership(T* p, uint size, uint capacity) {
    // To to prevent the caller from obviously shooting themselves in the foot.
    if (((p + capacity) > m_p) && (p < (m_p + m_capacity))) {
      // Can grant ownership of a block inside the container itself!
      CRNLIB_ASSERT(0);
      return false;
    }

    if (size > capacity) {
      CRNLIB_ASSERT(0);
      return false;
    }

    if (!p) {
      if (capacity) {
        CRNLIB_ASSERT(0);
        return false;
      }
    } else if (!capacity) {
      CRNLIB_ASSERT(0);
      return false;
    }

    clear();
    m_p = p;
    m_size = size;
    m_capacity = capacity;
    return true;
  }